

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.c
# Opt level: O2

_Bool get_bool(char *value)

{
  int iVar1;
  _Bool _Var2;
  
  iVar1 = strcmp(value,"true");
  if (iVar1 == 0) {
    _Var2 = true;
  }
  else {
    iVar1 = strcmp(value,"false");
    if (iVar1 == 0) {
      _Var2 = false;
    }
    else {
      iVar1 = atoi(value);
      _Var2 = iVar1 != 0;
    }
  }
  return _Var2;
}

Assistant:

static bool get_bool(char const *value)
{
   return streq(value, "true") ? true
      : streq(value, "false") ? false
      : atoi(value);
}